

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void CopyPlane(uint8_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *CopyRow;
  int y;
  code *in_stack_ffffffffffffffc0;
  int test_flag;
  code *local_38;
  code *local_30;
  int local_28;
  int local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  uint local_c;
  long local_8;
  
  local_30 = CopyRow_C;
  local_24 = in_R9D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  if (in_R9D < 0) {
    local_24 = -in_R9D;
    local_18 = in_RDX + (int)((local_24 + -1) * in_ECX);
    local_1c = -in_ECX;
  }
  local_20 = in_R8D;
  local_c = in_ESI;
  if ((in_ESI == in_R8D) && (local_1c == in_R8D)) {
    local_20 = local_24 * in_R8D;
    local_24 = 1;
    local_1c = 0;
    local_c = 0;
  }
  if ((in_RDI != local_18) || (local_c != local_1c)) {
    test_flag = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
    iVar1 = libyuv::TestCpuFlag(test_flag);
    if (iVar1 != 0) {
      if ((local_20 & 0x1f) == 0) {
        local_38 = CopyRow_SSE2;
      }
      else {
        local_38 = CopyRow_Any_SSE2;
      }
      local_30 = local_38;
    }
    iVar1 = libyuv::TestCpuFlag(test_flag);
    if (iVar1 != 0) {
      if ((local_20 & 0x3f) == 0) {
        in_stack_ffffffffffffffc0 = CopyRow_AVX;
        local_30 = in_stack_ffffffffffffffc0;
      }
      else {
        in_stack_ffffffffffffffc0 = CopyRow_Any_AVX;
        local_30 = in_stack_ffffffffffffffc0;
      }
    }
    iVar1 = libyuv::TestCpuFlag((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (iVar1 != 0) {
      local_30 = CopyRow_ERMS;
    }
    local_8 = in_RDI;
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      (*local_30)(local_8,local_18,local_20);
      local_8 = local_8 + (int)local_c;
      local_18 = local_18 + (int)local_1c;
    }
  }
  return;
}

Assistant:

LIBYUV_API
void CopyPlane(const uint8_t* src_y,
               int src_stride_y,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  int y;
  void (*CopyRow)(const uint8_t* src, uint8_t* dst, int width) = CopyRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
  // Nothing to do.
  if (src_y == dst_y && src_stride_y == dst_stride_y) {
    return;
  }

#if defined(HAS_COPYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    CopyRow = IS_ALIGNED(width, 32) ? CopyRow_SSE2 : CopyRow_Any_SSE2;
  }
#endif
#if defined(HAS_COPYROW_AVX)
  if (TestCpuFlag(kCpuHasAVX)) {
    CopyRow = IS_ALIGNED(width, 64) ? CopyRow_AVX : CopyRow_Any_AVX;
  }
#endif
#if defined(HAS_COPYROW_ERMS)
  if (TestCpuFlag(kCpuHasERMS)) {
    CopyRow = CopyRow_ERMS;
  }
#endif
#if defined(HAS_COPYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    CopyRow = IS_ALIGNED(width, 32) ? CopyRow_NEON : CopyRow_Any_NEON;
  }
#endif

  // Copy plane
  for (y = 0; y < height; ++y) {
    CopyRow(src_y, dst_y, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}